

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

size_t rtosc_scan_message(char *src,char *address,size_t adrsize,rtosc_arg_val_t *args,size_t n,
                         char *buffer_for_strings,size_t bufsize)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  char cVar6;
  ulong uVar7;
  byte *src_00;
  ulong uVar8;
  byte *local_58;
  ulong local_50;
  rtosc_arg_val_t *local_48;
  size_t local_40;
  char *local_38;
  
  uVar8 = 0;
  local_48 = args;
  local_40 = n;
  local_38 = buffer_for_strings;
  while ((uVar7 = (ulong)src[uVar8], uVar7 != 0 &&
         (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + uVar7 * 2 + 1) & 0x20) != 0))) {
    uVar8 = uVar8 + 1;
  }
  local_58 = (byte *)(src + uVar8);
  local_50 = adrsize;
  while (uVar2 = local_50, src_00 = local_58, (char)uVar7 == '%') {
    iVar3 = skip_fmt((char **)&local_58,"%*[^\n] %n");
    uVar8 = uVar8 + (long)iVar3;
    uVar7 = (ulong)*local_58;
  }
  for (; ((cVar6 = (char)uVar7, cVar6 != '\0' &&
          (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar6 * 2 + 1) & 0x20) == 0)
          ) && (uVar8 < uVar2)); uVar8 = uVar8 + 1) {
    *address = cVar6;
    address = address + 1;
    uVar7 = (ulong)src_00[1];
    src_00 = src_00 + 1;
  }
  *address = '\0';
  local_58 = src_00;
  while ((bVar1 = *src_00, (long)(char)bVar1 != 0 &&
         (ppuVar4 = __ctype_b_loc(),
         (*(byte *)((long)*ppuVar4 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0))) {
    uVar8 = uVar8 + 1;
    src_00 = src_00 + 1;
  }
  sVar5 = rtosc_scan_arg_vals((char *)src_00,local_48,local_40,local_38,bufsize);
  return sVar5 + uVar8;
}

Assistant:

size_t rtosc_scan_message(const char* src,
                          char* address, size_t adrsize,
                          rtosc_arg_val_t *args, size_t n,
                          char* buffer_for_strings, size_t bufsize)
{
    size_t rd = 0;
    for(;*src && isspace(*src); ++src) ++rd;
    while (*src == '%')
        rd += skip_fmt(&src, "%*[^\n] %n");

    assert(*src == '/');
    for(; *src && !isspace(*src) && rd < adrsize; ++rd)
        *address++ = *src++;
    assert(rd < adrsize); // otherwise, the address was too long
    *address = 0;

    for(;*src && isspace(*src); ++src) ++rd;

    rd += rtosc_scan_arg_vals(src, args, n, buffer_for_strings, bufsize);

    return rd;
}